

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

RequiredExtensions *
deqp::gls::TextureStateQueryTests::anon_unknown_1::es31::getQueryExtension
          (RequiredExtensions *__return_storage_ptr__,QueryType query)

{
  QueryType query_local;
  
  if ((((query - QUERY_TEXTURE_PARAM_PURE_INTEGER < 2) ||
       (query - QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4 < 2)) ||
      (query - QUERY_SAMPLER_PARAM_PURE_INTEGER < 2)) ||
     (query == QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4 ||
      query == QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER_VEC4)) {
    RequiredExtensions::RequiredExtensions(__return_storage_ptr__,"GL_EXT_texture_border_clamp");
  }
  else {
    RequiredExtensions::RequiredExtensions(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static RequiredExtensions getQueryExtension (QueryType query)
{
	switch (query)
	{
		case QUERY_TEXTURE_PARAM_PURE_INTEGER:
		case QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER:
		case QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4:
		case QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4:
		case QUERY_SAMPLER_PARAM_PURE_INTEGER:
		case QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER:
		case QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4:
		case QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER_VEC4:
			return RequiredExtensions("GL_EXT_texture_border_clamp");

		default:
			DE_ASSERT(false);
			return RequiredExtensions();
	}
}